

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdKelvinClipidId::emulate_mthd(MthdKelvinClipidId *this)

{
  _Bool _Var1;
  MthdKelvinClipidId *this_local;
  
  pgraph_kelvin_check_err19(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  _Var1 = nv04_pgraph_is_kelvin_class
                    (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  if (_Var1) {
    pgraph_kelvin_check_err18(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  }
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource == 0) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_clipid_id =
         (this->super_SingleMthdTest).super_MthdTest.val & 0xff;
    pgraph_bundle(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x44,0,
                  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_clipid_id,
                  true);
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_kelvin_check_err19(&exp);
		if (nv04_pgraph_is_kelvin_class(&exp))
			pgraph_kelvin_check_err18(&exp);
		if (!exp.nsource) {
			exp.bundle_clipid_id = val & 0xff;
			pgraph_bundle(&exp, BUNDLE_CLIPID_ID, 0, exp.bundle_clipid_id, true);
		}
	}